

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O0

GArray * g_array_insert_vals(GArray *farray,guint index_,gconstpointer data,guint len)

{
  GArray *farray_00;
  GRealArray *array;
  guint len_local;
  gconstpointer data_local;
  guint index__local;
  GArray *farray_local;
  
  farray_local = farray;
  if (len != 0) {
    if (index_ < farray->len) {
      g_array_maybe_expand((GRealArray *)farray,len);
      memmove(farray->data + *(int *)&farray[1].data * (len + index_),
              farray->data + *(int *)&farray[1].data * index_,
              (ulong)(*(int *)&farray[1].data * (farray->len - index_)));
      memcpy(farray->data + *(int *)&farray[1].data * index_,data,
             (ulong)(*(int *)&farray[1].data * len));
      farray->len = len + farray->len;
      if (((ulong)farray[1].data & 0x100000000) != 0) {
        memset(farray->data + *(int *)&farray[1].data * farray->len,0,
               (ulong)*(uint *)&farray[1].data);
      }
    }
    else {
      g_array_maybe_expand((GRealArray *)farray,(index_ - farray->len) + len);
      farray_00 = g_array_set_size(farray,index_);
      farray_local = g_array_append_vals(farray_00,data,len);
    }
  }
  return farray_local;
}

Assistant:

GArray* g_array_insert_vals (GArray        *farray,
        guint          index_,
        gconstpointer  data,
        guint          len)
{
    GRealArray *array = (GRealArray*) farray;

    g_return_val_if_fail (array, NULL);

    if (len == 0)
        return farray;

    /* Is the index off the end of the array, and hence do we need to over-allocate
     * and clear some elements? */
    if (index_ >= array->len)
    {
        g_array_maybe_expand (array, index_ - array->len + len);
        return g_array_append_vals (g_array_set_size (farray, index_), data, len);
    }

    g_array_maybe_expand (array, len);

    memmove (g_array_elt_pos (array, len + index_),
            g_array_elt_pos (array, index_),
            g_array_elt_len (array, array->len - index_));

    memcpy (g_array_elt_pos (array, index_), data, g_array_elt_len (array, len));

    array->len += len;

    g_array_zero_terminate (array);

    return farray;
}